

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall cmState::RemoveUserDefinedCommands(cmState *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr __n;
  mapped_type pcVar2;
  _Alloc_hider _Var3;
  char cVar4;
  int iVar5;
  _Base_ptr p_Var6;
  mapped_type *ppcVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
  *this_00;
  _Self __tmp;
  iterator __position;
  cmCommand **ppcVar8;
  bool bVar9;
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> renamedCommands;
  cmCommand **local_88;
  iterator iStack_80;
  cmCommand **local_78;
  string local_70;
  string local_50;
  
  local_88 = (cmCommand **)0x0;
  iStack_80._M_current = (cmCommand **)0x0;
  local_78 = (cmCommand **)0x0;
  __position._M_node = (this->Commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Commands)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    this_00 = &this->Commands;
    do {
      cVar4 = (**(code **)(**(long **)(__position._M_node + 2) + 0x18))
                        (*(long **)(__position._M_node + 2),"cmMacroHelperCommand");
      p_Var6 = __position._M_node + 2;
      if ((cVar4 == '\0') &&
         (iVar5 = (*((*(cmCommand **)p_Var6)->super_cmObject)._vptr_cmObject[3])
                            (*(cmCommand **)p_Var6,"cmFunctionHelperCommand"), (char)iVar5 == '\0'))
      {
        (*((*(cmCommand **)p_Var6)->super_cmObject)._vptr_cmObject[0xb])(&local_70);
        _Var3._M_p = local_70._M_dataplus._M_p;
        __n = __position._M_node[1]._M_parent;
        if (__n == (_Base_ptr)local_70._M_string_length) {
          if (__n == (_Base_ptr)0x0) {
            bVar9 = false;
          }
          else {
            iVar5 = bcmp(*(void **)(__position._M_node + 1),local_70._M_dataplus._M_p,(size_t)__n);
            bVar9 = iVar5 != 0;
          }
        }
        else {
          bVar9 = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var3._M_p != &local_70.field_2) {
          operator_delete(_Var3._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (bVar9) {
          if (iStack_80._M_current == local_78) {
            std::vector<cmCommand*,std::allocator<cmCommand*>>::_M_realloc_insert<cmCommand*const&>
                      ((vector<cmCommand*,std::allocator<cmCommand*>> *)&local_88,iStack_80,
                       (cmCommand **)p_Var6);
          }
          else {
            *iStack_80._M_current = *(cmCommand **)p_Var6;
            iStack_80._M_current = iStack_80._M_current + 1;
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
          ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                              *)this_00,__position);
        }
        else {
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
      }
      else {
        if (*(cmCommand **)p_Var6 != (cmCommand *)0x0) {
          (*((*(cmCommand **)p_Var6)->super_cmObject)._vptr_cmObject[1])();
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                            *)this_00,__position);
      }
      __position._M_node = p_Var6;
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    if (local_88 != iStack_80._M_current) {
      ppcVar8 = local_88;
      do {
        pcVar2 = *ppcVar8;
        (*(pcVar2->super_cmObject)._vptr_cmObject[0xb])(&local_50,pcVar2);
        cmsys::SystemTools::LowerCase(&local_70,&local_50);
        ppcVar7 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
                  ::operator[](this_00,&local_70);
        *ppcVar7 = pcVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        ppcVar8 = ppcVar8 + 1;
      } while (ppcVar8 != iStack_80._M_current);
    }
    if (local_88 != (cmCommand **)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
  }
  return;
}

Assistant:

cmState::~cmState()
{
  delete this->CacheManager;
  cmDeleteAll(this->Commands);
}